

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicCmpxchg
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,AtomicCmpxchg *curr,
          optional<wasm::Type> type)

{
  bool bVar1;
  Expression **ppEVar2;
  Type *pTVar3;
  bool local_71;
  bool local_61;
  BasicType local_50 [4];
  size_t local_40;
  char *local_38;
  BasicType local_30 [2];
  AtomicCmpxchg *local_28;
  AtomicCmpxchg *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::Type> type_local;
  
  this_local = type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
  type_local.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._0_1_ =
       type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  local_28 = curr;
  curr_local = (AtomicCmpxchg *)this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  local_61 = true;
  if (bVar1) {
    pTVar3 = std::optional<wasm::Type>::operator*((optional<wasm::Type> *)&this_local);
    local_30[1] = 2;
    bVar1 = wasm::Type::operator==(pTVar3,local_30 + 1);
    local_61 = true;
    if (!bVar1) {
      pTVar3 = std::optional<wasm::Type>::operator*((optional<wasm::Type> *)&this_local);
      local_30[0] = i64;
      local_61 = wasm::Type::operator==(pTVar3,local_30);
    }
  }
  if (local_61 != false) {
    local_40 = (local_28->memory).super_IString.str._M_len;
    local_38 = (local_28->memory).super_IString.str._M_str;
    notePointer(this,&local_28->ptr,(Name)(local_28->memory).super_IString.str);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
    if (!bVar1) {
      local_50[3] = 3;
      bVar1 = wasm::Type::operator==(&local_28->expected->type,local_50 + 3);
      local_71 = true;
      if (!bVar1) {
        local_50[2] = 3;
        local_71 = wasm::Type::operator==(&local_28->replacement->type,local_50 + 2);
      }
      if (local_71 == false) {
        local_50[0] = i32;
        std::optional<wasm::Type>::operator=((optional<wasm::Type> *)&this_local,local_50);
      }
      else {
        local_50[1] = 3;
        std::optional<wasm::Type>::operator=((optional<wasm::Type> *)&this_local,local_50 + 1);
      }
    }
    ppEVar2 = &local_28->expected;
    pTVar3 = std::optional<wasm::Type>::operator*((optional<wasm::Type> *)&this_local);
    note(this,ppEVar2,(Type)pTVar3->id);
    ppEVar2 = &local_28->replacement;
    pTVar3 = std::optional<wasm::Type>::operator*((optional<wasm::Type> *)&this_local);
    note(this,ppEVar2,(Type)pTVar3->id);
    return;
  }
  __assert_fail("!type || *type == Type::i32 || *type == Type::i64",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0xcf,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicCmpxchg(AtomicCmpxchg *, std::optional<Type>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitAtomicCmpxchg(AtomicCmpxchg* curr,
                          std::optional<Type> type = std::nullopt) {
    assert(!type || *type == Type::i32 || *type == Type::i64);
    notePointer(&curr->ptr, curr->memory);
    if (!type) {
      if (curr->expected->type == Type::i64 ||
          curr->replacement->type == Type::i64) {
        type = Type::i64;
      } else {
        type = Type::i32;
      }
    }
    note(&curr->expected, *type);
    note(&curr->replacement, *type);
  }